

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O1

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleObjectRefNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  _Head_base<0UL,_Assimp::OpenGEX::OpenGEXImporter::RefInfo_*,_false> _Var1;
  pointer pbVar2;
  pointer pbVar3;
  uint *puVar4;
  RefInfo *pRVar5;
  runtime_error *this_00;
  ulong uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objRefNames;
  _Head_base<0UL,_Assimp::OpenGEX::OpenGEXImporter::RefInfo_*,_false> local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (this->m_currentNode != (aiNode *)0x0) {
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    getRefNames(node,&local_48);
    pbVar3 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar2 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (this->m_tokenType == 5) {
      uVar6 = (long)local_48.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_48.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      this->m_currentNode->mNumMeshes = (uint)uVar6;
      puVar4 = (uint *)operator_new__(-(ulong)(uVar6 >> 0x3e != 0) |
                                      (long)local_48.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_48.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3);
      this->m_currentNode->mMeshes = puVar4;
      if (pbVar2 != pbVar3) {
        pRVar5 = (RefInfo *)operator_new(0x28);
        pRVar5->m_node = this->m_currentNode;
        pRVar5->m_type = MeshRef;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&pRVar5->m_Names,&local_48);
        local_50._M_head_impl = pRVar5;
        std::
        vector<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>,std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>>>
        ::
        emplace_back<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>>
                  ((vector<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>,std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>>>
                    *)&this->m_unresolvedRefStack,
                   (unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>
                    *)&local_50);
        _Var1._M_head_impl = local_50._M_head_impl;
        if (local_50._M_head_impl != (RefInfo *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&(local_50._M_head_impl)->m_Names);
          operator_delete(_Var1._M_head_impl);
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"No parent node for name.","")
  ;
  std::runtime_error::runtime_error(this_00,(string *)&local_48);
  *(undefined ***)this_00 = &PTR__runtime_error_00896c98;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OpenGEXImporter::handleObjectRefNode( DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == m_currentNode ) {
        throw DeadlyImportError( "No parent node for name." );
        return;
    }

    std::vector<std::string> objRefNames;
    getRefNames( node, objRefNames );

    // when we are dealing with a geometry node prepare the mesh cache
    if ( m_tokenType == Grammar::GeometryNodeToken ) {
        m_currentNode->mNumMeshes = static_cast<unsigned int>(objRefNames.size());
        m_currentNode->mMeshes = new unsigned int[ objRefNames.size() ];
        if ( !objRefNames.empty() ) {
            m_unresolvedRefStack.push_back( std::unique_ptr<RefInfo>( new RefInfo( m_currentNode, RefInfo::MeshRef, objRefNames ) ) );
        }
    } else if ( m_tokenType == Grammar::LightNodeToken ) {
        // TODO!
    } else if ( m_tokenType == Grammar::CameraNodeToken ) {
        // TODO!
    }
}